

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_UTF8Reader.h
# Opt level: O3

bool __thiscall
soul::UTF8Reader::advanceIfStartsWith<char_const*,char_const*,char_const*>
          (UTF8Reader *this,char *text,char *others,char *others_1,char *others_2)

{
  byte bVar1;
  bool bVar2;
  UnicodeChar UVar3;
  UTF8Reader t;
  UTF8Reader local_38;
  
  local_38 = (UTF8Reader)this->data;
  do {
    bVar1 = *text;
    if (bVar1 == 0) {
      this->data = (char *)local_38;
      return true;
    }
    text = (char *)((byte *)text + 1);
    UVar3 = getAndAdvance(&local_38);
  } while (UVar3 == bVar1);
  bVar2 = advanceIfStartsWith<char_const*,char_const*>(this,others,others_1,others_2);
  return bVar2;
}

Assistant:

bool advanceIfStartsWith (const char* text, Args... others)      { return advanceIfStartsWith (text) || advanceIfStartsWith (others...); }